

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRules
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this)

{
  NFRuleSet **local_28;
  NFRuleSet **p;
  RuleBasedNumberFormat *this_local;
  UnicodeString *result;
  
  UnicodeString::UnicodeString(__return_storage_ptr__);
  if (this->fRuleSets != (NFRuleSet **)0x0) {
    for (local_28 = this->fRuleSets; *local_28 != (NFRuleSet *)0x0; local_28 = local_28 + 1) {
      NFRuleSet::appendRules(*local_28,__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
RuleBasedNumberFormat::getRules() const
{
    UnicodeString result;
    if (fRuleSets != NULL) {
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            (*p)->appendRules(result);
        }
    }
    return result;
}